

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O1

bool __thiscall cmArchiveWrite::AddFile(cmArchiveWrite *this,char *file,size_t skip,char *prefix)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar2;
  bool bVar3;
  int iVar4;
  mode_t mVar5;
  size_t sVar6;
  ostream *poVar7;
  archive_entry *entry;
  time_t t;
  char *pcVar8;
  size_t size;
  time_t now;
  string dest;
  allocator local_99;
  wstring local_98;
  char *local_78;
  string local_70;
  string local_50;
  
  sVar6 = strlen(file);
  if (sVar6 <= skip) {
    return true;
  }
  local_78 = setlocale(0,(char *)0x0);
  setlocale(0,"");
  if (prefix == (char *)0x0) {
    prefix = "";
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  sVar6 = strlen(prefix);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,prefix,prefix + sVar6);
  std::__cxx11::string::append((char *)&local_70);
  if (this->Verbose == true) {
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_70._M_dataplus._M_p,local_70._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  }
  entry = archive_entry_new();
  std::__cxx11::string::string((string *)&local_50,file,&local_99);
  cmsys::Encoding::ToWide(&local_98,&local_50);
  archive_entry_copy_sourcepath_w(entry,local_98._M_dataplus._M_p);
  paVar2 = &local_98.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  cmsys::Encoding::ToWide(&local_98,&local_70);
  archive_entry_copy_pathname_w(entry,local_98._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity * 4 + 4);
  }
  iVar4 = archive_read_disk_entry_from_file(this->Disk,entry,-1,(stat *)0x0);
  if (iVar4 == 0) {
    if ((this->MTime)._M_string_length == 0) {
LAB_00271c0e:
      if (((this->Uid).IsValueSet == true) && ((this->Gid).IsValueSet == true)) {
        archive_entry_set_uid(entry,(long)(this->Uid).Value);
        archive_entry_set_gid(entry,(long)(this->Gid).Value);
      }
      if (((this->Uname)._M_string_length != 0) && ((this->Gname)._M_string_length != 0)) {
        archive_entry_set_uname(entry,(this->Uname)._M_dataplus._M_p);
        archive_entry_set_gname(entry,(this->Gname)._M_dataplus._M_p);
      }
      if ((this->Permissions).IsValueSet == true) {
        archive_entry_set_perm(entry,(this->Permissions).Value);
      }
      if ((this->PermissionsMask).IsValueSet == true) {
        mVar5 = archive_entry_perm(entry);
        archive_entry_set_perm(entry,mVar5 & (this->PermissionsMask).Value);
      }
      archive_entry_acl_clear(entry);
      archive_entry_xattr_clear(entry);
      archive_entry_set_fflags(entry,0,0);
      iVar4 = std::__cxx11::string::compare((char *)&this->Format);
      if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)&this->Format), iVar4 == 0)
         ) {
        archive_entry_sparse_clear(entry);
      }
      iVar4 = archive_write_header(this->Archive,entry);
      if (iVar4 == 0) {
        pcVar8 = archive_entry_symlink(entry);
        if ((pcVar8 == (char *)0x0) && (size = archive_entry_size(entry), size != 0)) {
          bVar3 = AddData(this,file,size);
        }
        else {
          bVar3 = true;
        }
        goto LAB_00271d68;
      }
      std::__cxx11::string::_M_replace
                ((ulong)&this->Error,0,(char *)(this->Error)._M_string_length,0x4c62f7);
      cm_archive_error_string_abi_cxx11_((string *)&local_98,this->Archive);
      std::__cxx11::string::_M_append((char *)&this->Error,(ulong)local_98._M_dataplus._M_p);
      goto LAB_00271d4f;
    }
    time((time_t *)&local_98);
    t = cm_get_date((time_t)local_98._M_dataplus._M_p,(this->MTime)._M_dataplus._M_p);
    if (t != -1) {
      archive_entry_set_mtime(entry,t,0);
      goto LAB_00271c0e;
    }
    psVar1 = &this->Error;
    std::__cxx11::string::_M_replace
              ((ulong)psVar1,0,(char *)(this->Error)._M_string_length,0x4c62df);
    std::__cxx11::string::_M_append((char *)psVar1,(ulong)(this->MTime)._M_dataplus._M_p);
    std::__cxx11::string::append((char *)psVar1);
  }
  else {
    psVar1 = &this->Error;
    std::__cxx11::string::_M_replace
              ((ulong)psVar1,0,(char *)(this->Error)._M_string_length,0x4c62bb);
    std::__cxx11::string::append((char *)psVar1);
    std::__cxx11::string::append((char *)psVar1);
    cm_archive_error_string_abi_cxx11_((string *)&local_98,this->Disk);
    std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_98._M_dataplus._M_p);
LAB_00271d4f:
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  bVar3 = false;
LAB_00271d68:
  archive_entry_free(entry);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  setlocale(0,local_78);
  return bVar3;
}

Assistant:

bool cmArchiveWrite::AddFile(const char* file,
                             size_t skip, const char* prefix)
{
  // Skip the file if we have no name for it.  This may happen on a
  // top-level directory, which does not need to be included anyway.
  if(skip >= strlen(file))
    {
    return true;
    }
  const char* out = file + skip;

  cmLocaleRAII localeRAII;
  static_cast<void>(localeRAII);

  // Meta-data.
  std::string dest = prefix? prefix : "";
  dest += out;
  if(this->Verbose)
    {
    std::cout << dest << "\n";
    }
  Entry e;
  cm_archive_entry_copy_sourcepath(e, file);
  cm_archive_entry_copy_pathname(e, dest);
  if(archive_read_disk_entry_from_file(this->Disk, e, -1, 0) != ARCHIVE_OK)
    {
    this->Error = "archive_read_disk_entry_from_file '";
    this->Error += file;
    this->Error += "': ";
    this->Error += cm_archive_error_string(this->Disk);
    return false;
    }
  if (!this->MTime.empty())
    {
    time_t now;
    time(&now);
    time_t t = cm_get_date(now, this->MTime.c_str());
    if (t == -1)
      {
      this->Error = "unable to parse mtime '";
      this->Error += this->MTime;
      this->Error += "'";
      return false;
      }
    archive_entry_set_mtime(e, t, 0);
    }

  // manages the uid/guid of the entry (if any)
  if (this->Uid.IsSet() && this->Gid.IsSet())
    {
    archive_entry_set_uid(e, this->Uid.Get());
    archive_entry_set_gid(e, this->Gid.Get());
    }

  if (this->Uname.size() && this->Gname.size())
    {
    archive_entry_set_uname(e, this->Uname.c_str());
    archive_entry_set_gname(e, this->Gname.c_str());
    }


  // manages the permissions
  if (this->Permissions.IsSet())
    {
    archive_entry_set_perm(e, this->Permissions.Get());
    }

  if (this->PermissionsMask.IsSet())
    {
    mode_t perm = archive_entry_perm(e);
    archive_entry_set_perm(e, perm & this->PermissionsMask.Get());
    }

  // Clear acl and xattr fields not useful for distribution.
  archive_entry_acl_clear(e);
  archive_entry_xattr_clear(e);
  archive_entry_set_fflags(e, 0, 0);

  if (this->Format == "pax" || this->Format == "paxr")
    {
    // Sparse files are a GNU tar extension.
    // Do not use them in standard tar files.
    archive_entry_sparse_clear(e);
    }

  if(archive_write_header(this->Archive, e) != ARCHIVE_OK)
    {
    this->Error = "archive_write_header: ";
    this->Error += cm_archive_error_string(this->Archive);
    return false;
    }

  // do not copy content of symlink
  if (!archive_entry_symlink(e))
    {
    // Content.
    if(size_t size = static_cast<size_t>(archive_entry_size(e)))
      {
      return this->AddData(file, size);
      }
    }
  return true;
}